

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O3

void __thiscall Farm::editTruck(Farm *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  _Alloc_hider _Var3;
  char cVar4;
  bool bVar5;
  int iVar6;
  pointer this_00;
  string plate;
  double capacity;
  string local_a0;
  undefined1 *local_80;
  size_t local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  Farm *local_60;
  double local_58;
  string local_50;
  
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter truck\'s plate: ",0x15);
  cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x50);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_80,cVar4);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_80,local_80 + local_78);
  bVar5 = searchTruckByPlate(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    paVar1 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"Enter truck\'s new capacity: ","");
    getDouble(&local_58,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    this_00 = (this->trucks).super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
              super__Vector_impl_data._M_start;
    pTVar2 = (this->trucks).super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_60 = this;
    if (this_00 != pTVar2) {
      do {
        Truck::getPlate_abi_cxx11_(&local_a0,this_00);
        _Var3._M_p = local_a0._M_dataplus._M_p;
        if (local_a0._M_string_length == local_78) {
          if (local_a0._M_string_length == 0) {
            bVar5 = true;
          }
          else {
            iVar6 = bcmp(local_a0._M_dataplus._M_p,local_80,local_a0._M_string_length);
            bVar5 = iVar6 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != paVar1) {
          operator_delete(_Var3._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (bVar5) {
          Truck::setCapacity(this_00,local_58);
          break;
        }
        this_00 = this_00 + 1;
      } while (this_00 != pTVar2);
    }
    local_60->farmFileChanged = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Truck successfully edited!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ENTER to go back","");
    enterWait(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar1) goto LAB_001251c7;
  }
  else {
    paVar1 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"ERROR: It doesn\'t exist a truck with the given plate!","");
    cinERR(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ENTER to go back","");
    enterWait(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar1) goto LAB_001251c7;
  }
  operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
LAB_001251c7:
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return;
}

Assistant:

void Farm::editTruck() {
    string plate;
    double capacity;

    cout << "Enter truck's plate: ";
    getline(cin, plate);
    if(!searchTruckByPlate(plate)){
        cinERR("ERROR: It doesn't exist a truck with the given plate!");
        enterWait();
        return;
    }

    getDouble(capacity, "Enter truck's new capacity: ");

    for(auto &truck : trucks){
        if(truck.getPlate() == plate){
            truck.setCapacity(capacity);
            break;
        }
    }

    farmFileChanged = true;
    cout << "Truck successfully edited!" << endl;
    enterWait();
}